

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O2

bool __thiscall Arbitrarystring::Run(Arbitrarystring *this)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vv;
  string v;
  
  testinator::
  Arbitrary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  generate(&v,1,0);
  testinator::
  Arbitrary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  shrink(&vv,&v);
  if ((long)vv.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)vv.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x40) {
    bVar1 = vv.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length +
            (vv.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == v._M_string_length;
  }
  else {
    bVar1 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vv);
  std::__cxx11::string::~string((string *)&v);
  return bVar1;
}

Assistant:

DEF_TEST(string, Arbitrary)
{
  testinator::Arbitrary<string> a;
  string v = a.generate(1,0);
  vector<string> vv = a.shrink(v);
  return vv.size() == 2
    && vv[0].size() + vv[1].size() == v.size();
}